

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

mmkuser_malloc_mock_returntype mmkuser_malloc_mock_stub(size_t param0)

{
  mmk_matcher_kind mVar1;
  mmk_matcher *pmVar2;
  ulong uVar3;
  mmk_params *pmVar4;
  void *pvVar5;
  mmk_va_info *pmVar6;
  int iVar7;
  mmk_matcher *pmVar8;
  mmk_stub_conflict stub;
  mmk_mock_ctx *mock;
  void *data;
  mmk_result *pmVar9;
  mmk_params *pmVar10;
  long *prev;
  _func_void *p_Var11;
  int *piVar12;
  mmkuser_malloc_mock_returntype pvVar13;
  size_t t;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t local_40;
  
  pmVar8 = mmk_matcher_ctx();
  if (pmVar8 == (mmk_matcher *)0x0) {
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_40 = param0;
    mmk_verify_register_call(&local_58,0x20);
    pmVar10 = mmk_mock_get_params();
    if (pmVar10 != (mmk_params *)0x0) {
      while (pmVar8 = pmVar10->matcher_ctx->next, pmVar8 != (mmk_matcher *)0x0) {
        mVar1 = pmVar8->kind;
        if (mVar1 == MMK_MATCHER_ANY) goto LAB_0010268d;
        if ((mVar1 >> 0x1e & 1) == 0) {
          if (mVar1 == MMK_MATCHER_THAT) {
            p_Var11 = mmk_matcher_get_predicate(pmVar8);
            iVar7 = (*p_Var11)(param0);
            if (iVar7 == 0) goto LAB_001025fd;
          }
          goto LAB_0010268d;
        }
        pmVar4 = pmVar10[4].next;
        if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (pmVar4 != (mmk_params *)param0)) &&
            (((mVar1 & 4) != MMK_MATCHER_ANY || (pmVar4 <= param0)))) &&
           (((mVar1 & 8) != MMK_MATCHER_ANY || (param0 <= pmVar4)))) goto LAB_0010268d;
LAB_001025fd:
        pmVar10 = pmVar10->next;
        if (pmVar10 == (mmk_params *)0x0) {
          return (mmkuser_malloc_mock_returntype)0x0;
        }
      }
      if (pmVar10[4].next != (mmk_params *)param0) goto LAB_001025fd;
LAB_0010268d:
      iVar7 = *(int *)((long)&pmVar10[1].matcher_ctx + 4);
      if (iVar7 != 0) {
        piVar12 = __errno_location();
        *piVar12 = iVar7;
      }
      pmVar4 = pmVar10[1].next;
      if (pmVar10[2].matcher_ctx != (mmk_matcher *)0x0) {
        pvVar13 = (mmkuser_malloc_mock_returntype)(*(code *)pmVar10[2].matcher_ctx)(param0);
        if (pmVar4 != (mmk_params *)0x0) {
          return (pmVar10[1].next)->matcher_ctx;
        }
        return pvVar13;
      }
      if (pmVar4 != (mmk_params *)0x0) {
        return pmVar4->matcher_ctx;
      }
    }
  }
  else {
    stub = mmk_ctx();
    mock = (mmk_mock_ctx *)mmk_stub_context(stub);
    mmk_mock_report_call();
    if (pmVar8->kind == MMK_MATCHER_THAT) {
      prev = (long *)mmk_mock_params_begin(mock);
      if (prev == (long *)0x0) {
        t = 0;
      }
      else {
        t = 0;
        do {
          pmVar2 = pmVar8->next;
          if (pmVar2 == (mmk_matcher *)0x0) {
            if (prev[3] != param0) goto LAB_00102657;
LAB_00102653:
            t = t + *prev;
          }
          else {
            mVar1 = pmVar2->kind;
            if (mVar1 == MMK_MATCHER_ANY) goto LAB_00102653;
            if ((mVar1 >> 0x1e & 1) == 0) {
              if (mVar1 == MMK_MATCHER_THAT) {
                p_Var11 = mmk_matcher_get_predicate(pmVar2);
                iVar7 = (*p_Var11)(prev[3]);
                if (iVar7 == 0) goto LAB_00102657;
              }
              goto LAB_00102653;
            }
            uVar3 = prev[3];
            if (((((mVar1 & 2) != MMK_MATCHER_ANY) || (uVar3 != param0)) &&
                (((mVar1 & 4) != MMK_MATCHER_ANY || (param0 <= uVar3)))) &&
               (((mVar1 & 8) != MMK_MATCHER_ANY || (uVar3 <= param0)))) goto LAB_00102653;
          }
LAB_00102657:
          prev = (long *)mmk_mock_params_next(mock,prev);
        } while (prev != (long *)0x0);
      }
      do {
        pmVar2 = pmVar8->next;
        mmk_free(pmVar8);
        pmVar8 = pmVar2;
      } while (pmVar2 != (mmk_matcher *)0x0);
      mmk_verify_set_times(t);
    }
    else if (pmVar8->kind == MMK_MATCHER_ANY) {
      data = mmk_malloc(0x50);
      pmVar9 = mmk_when_get_result();
      pvVar5 = pmVar9->then_return;
      p_Var11 = pmVar9->then_call;
      pmVar6 = pmVar9->with_va;
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)pmVar9;
      *(void **)((long)data + 0x18) = pvVar5;
      *(_func_void **)((long)data + 0x20) = p_Var11;
      *(mmk_va_info **)((long)data + 0x28) = pmVar6;
      *(size_t *)((long)data + 0x48) = param0;
      mmk_when_impl(mock,data);
    }
  }
  return (mmkuser_malloc_mock_returntype)0x0;
}

Assistant:

void test_simple_case(void)
{
    static char ref[] = "hello";
    char buf[sizeof (ref)];

    malloc_mock m = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) m != MMK_MOCK_INVALID);

    mmk_when(malloc(sizeof(ref)), .then_return = &(char*) { buf });

    char *dup = my_strdup("hello");

    /* mmk_verify is overkill in this case, mmk_verify should be used when you
     * care about testing interactions rather than external behaviour */
    int pass = mmk_verify(malloc(mmk_ge(size_t, sizeof (ref))), .times = 1);

    mmk_assert(pass);
    mmk_assert(dup == buf && !strcmp(ref, buf));

    mmk_reset(malloc);
}